

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.h
# Opt level: O1

void GEN_CS::gen_cs_example_dm<false>(cb_to_cs *c,example *ec,label *cs_ld)

{
  label *this;
  wclass *pwVar1;
  cb_class *pcVar2;
  long lVar3;
  ulong uVar4;
  float index;
  cb_class *__begin3;
  wclass *pwVar5;
  cb_class *__end3;
  float fVar6;
  float fVar7;
  float fVar8;
  float local_50;
  wclass local_4c;
  float local_3c;
  v_array<COST_SENSITIVE::wclass> *local_38;
  
  pwVar5 = (ec->l).cs.costs._begin;
  pwVar1 = (ec->l).cs.costs._end;
  local_38 = &cs_ld->costs;
  v_array<COST_SENSITIVE::wclass>::clear(&cs_ld->costs);
  this = &c->pred_scores;
  v_array<COST_SENSITIVE::wclass>::clear(&this->costs);
  lVar3 = (long)pwVar1 - (long)pwVar5 >> 4;
  if ((lVar3 == 0) || ((lVar3 == 1 && ((pwVar5->x != 3.4028235e+38 || (NAN(pwVar5->x))))))) {
    if (c->num_actions != 0) {
      fVar6 = 1.4013e-45;
      fVar7 = 3.4028235e+38;
      index = 1.4013e-45;
      do {
        local_4c.x = 0.0;
        local_4c.partial_prediction = 0.0;
        local_4c.wap_value = 0.0;
        local_4c.class_index = (uint32_t)index;
        local_3c = fVar7;
        fVar7 = CB_ALGS::get_cost_pred<false>(c->scorer,c->known_cost,ec,(uint32_t)index,0);
        if (fVar7 < local_3c) {
          fVar6 = index;
        }
        local_4c.x = fVar7;
        v_array<COST_SENSITIVE::wclass>::push_back(&this->costs,&local_4c);
        pcVar2 = c->known_cost;
        if ((pcVar2 != (cb_class *)0x0) && (index == (float)pcVar2->action)) {
          uVar4 = c->nb_ex_regressors + 1;
          c->nb_ex_regressors = uVar4;
          fVar8 = pcVar2->cost - local_4c.x;
          c->avg_loss_regressors =
               (fVar8 * fVar8 - c->avg_loss_regressors) * (1.0 / (float)uVar4) +
               c->avg_loss_regressors;
          c->last_pred_reg = local_4c.x;
          c->last_correct_cost = pcVar2->cost;
        }
        if (local_3c <= fVar7) {
          fVar7 = local_3c;
        }
        v_array<COST_SENSITIVE::wclass>::push_back(local_38,&local_4c);
        index = (float)((int)index + 1);
      } while ((uint)index <= c->num_actions);
      goto LAB_00245e9b;
    }
  }
  else if (pwVar5 != pwVar1) {
    fVar6 = 1.4013e-45;
    local_50 = 3.4028235e+38;
    do {
      local_4c.x = 0.0;
      local_4c.class_index = pwVar5->class_index;
      local_4c.partial_prediction = 0.0;
      local_4c.wap_value = 0.0;
      local_4c.x = CB_ALGS::get_cost_pred<false>(c->scorer,c->known_cost,ec,pwVar5->class_index,0);
      if (local_4c.x < local_50) {
LAB_00245dd7:
        fVar6 = (float)pwVar5->class_index;
        local_50 = local_4c.x;
      }
      else if (((local_4c.x == local_50) && (!NAN(local_4c.x) && !NAN(local_50))) &&
              (pwVar5->class_index < (uint)fVar6)) goto LAB_00245dd7;
      v_array<COST_SENSITIVE::wclass>::push_back(&this->costs,&local_4c);
      pcVar2 = c->known_cost;
      if ((pcVar2 != (cb_class *)0x0) && (pcVar2->action == pwVar5->class_index)) {
        uVar4 = c->nb_ex_regressors + 1;
        c->nb_ex_regressors = uVar4;
        fVar7 = pcVar2->cost - local_4c.x;
        c->avg_loss_regressors =
             (fVar7 * fVar7 - c->avg_loss_regressors) * (1.0 / (float)uVar4) +
             c->avg_loss_regressors;
        c->last_pred_reg = local_4c.x;
        c->last_correct_cost = pcVar2->cost;
      }
      v_array<COST_SENSITIVE::wclass>::push_back(local_38,&local_4c);
      pwVar5 = pwVar5 + 1;
    } while (pwVar5 != pwVar1);
    goto LAB_00245e9b;
  }
  fVar6 = 1.4013e-45;
LAB_00245e9b:
  (ec->pred).scalar = fVar6;
  return;
}

Assistant:

void gen_cs_example_dm(cb_to_cs& c, example& ec, COST_SENSITIVE::label& cs_ld)
{  // this implements the direct estimation method, where costs are directly specified by the learned regressor.
  CB::label ld = ec.l.cb;

  float min = FLT_MAX;
  uint32_t argmin = 1;
  // generate cost sensitive example
  cs_ld.costs.clear();
  c.pred_scores.costs.clear();

  if (ld.costs.size() == 0 ||
      (ld.costs.size() == 1 &&
          ld.costs[0].cost != FLT_MAX))  // this is a typical example where we can perform all actions
  {                                      // in this case generate cost-sensitive example with all actions
    for (uint32_t i = 1; i <= c.num_actions; i++)
    {
      COST_SENSITIVE::wclass wc = {0., i, 0., 0.};
      // get cost prediction for this action
      wc.x = CB_ALGS::get_cost_pred<is_learn>(c.scorer, c.known_cost, ec, i, 0);
      if (wc.x < min)
      {
        min = wc.x;
        argmin = i;
      }

      c.pred_scores.costs.push_back(wc);

      if (c.known_cost != nullptr && c.known_cost->action == i)
      {
        c.nb_ex_regressors++;
        c.avg_loss_regressors += (1.0f / c.nb_ex_regressors) *
            ((c.known_cost->cost - wc.x) * (c.known_cost->cost - wc.x) - c.avg_loss_regressors);
        c.last_pred_reg = wc.x;
        c.last_correct_cost = c.known_cost->cost;
      }

      cs_ld.costs.push_back(wc);
    }
  }
  else  // this is an example where we can only perform a subset of the actions
  {     // in this case generate cost-sensitive example with only allowed actions
    for (auto& cl : ld.costs)
    {
      COST_SENSITIVE::wclass wc = {0., cl.action, 0., 0.};

      // get cost prediction for this action
      wc.x = CB_ALGS::get_cost_pred<is_learn>(c.scorer, c.known_cost, ec, cl.action, 0);
      if (wc.x < min || (wc.x == min && cl.action < argmin))
      {
        min = wc.x;
        argmin = cl.action;
      }
      c.pred_scores.costs.push_back(wc);

      if (c.known_cost != nullptr && c.known_cost->action == cl.action)
      {
        c.nb_ex_regressors++;
        c.avg_loss_regressors += (1.0f / c.nb_ex_regressors) *
            ((c.known_cost->cost - wc.x) * (c.known_cost->cost - wc.x) - c.avg_loss_regressors);
        c.last_pred_reg = wc.x;
        c.last_correct_cost = c.known_cost->cost;
      }

      cs_ld.costs.push_back(wc);
    }
  }

  ec.pred.multiclass = argmin;
}